

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O1

void Lf_ManSetCutRefs(Lf_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  undefined8 uVar6;
  uint *puVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  
  if ((p->vMemSets).nSize * 0x1000 - (p->vFreeSets).nSize != 0) {
    printf("The number of used cutsets = %d.\n");
  }
  pGVar3 = p->pGia;
  uVar2 = pGVar3->nObjs;
  if ((0 < (int)uVar2) && (pGVar4 = pGVar3->pObjs, pGVar4 != (Gia_Obj_t *)0x0)) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      uVar5 = *(ulong *)(&pGVar4->field_0x0 + lVar11);
      uVar9 = (uint)uVar5;
      if ((uVar5 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
        if (*(int *)((long)&pGVar4->Value + lVar11) != 0) {
          __assert_fail("pObj->Value == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                        ,0x5af,"void Lf_ManSetCutRefs(Lf_Man_t *)");
        }
        if ((((int)uVar9 < 0) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar9 & 0x1fffffff) != ((uint)(uVar5 >> 0x20) & 0x1fffffff))) {
          iVar8 = (int)(uVar5 & 0x1fffffff);
          uVar6 = *(undefined8 *)((long)pGVar4 + lVar11 + (ulong)(uint)(iVar8 * 4) * -3);
          uVar9 = (uint)uVar6;
          if (((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) &&
             ((((uint)((ulong)uVar6 >> 0x20) ^ uVar9) & 0x1fffffff) != 0)) {
            piVar1 = (int *)((long)pGVar4 + lVar11 + (ulong)(uint)(iVar8 << 2) * -3 + 8);
            *piVar1 = *piVar1 + 1;
          }
          uVar12 = *(uint *)(&pGVar4->field_0x4 + lVar11) & 0x1fffffff;
          uVar6 = *(undefined8 *)((long)pGVar4 + (ulong)(uVar12 * 4) * -3 + lVar11);
          uVar9 = (uint)uVar6;
          if (((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) &&
             ((((uint)((ulong)uVar6 >> 0x20) ^ uVar9) & 0x1fffffff) != 0)) {
            piVar1 = (int *)((long)pGVar4 + lVar11 + (ulong)(uVar12 << 2) * -3 + 8);
            *piVar1 = *piVar1 + 1;
          }
          puVar7 = pGVar3->pMuxes;
          if ((puVar7 != (uint *)0x0) && (*(int *)((long)puVar7 + lVar10) != 0)) {
            if ((int)*(uint *)((long)puVar7 + lVar10) < 0) {
LAB_00760794:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar9 = *(uint *)((long)puVar7 + lVar10) >> 1;
            if ((int)uVar2 <= (int)uVar9) goto LAB_00760775;
            uVar12 = (uint)*(undefined8 *)(pGVar4 + uVar9);
            if (((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) &&
               ((((uint)((ulong)*(undefined8 *)(pGVar4 + uVar9) >> 0x20) ^ uVar12) & 0x1fffffff) !=
                0)) {
              if ((int)*(uint *)((long)puVar7 + lVar10) < 0) goto LAB_00760794;
              uVar9 = *(uint *)((long)puVar7 + lVar10) >> 1;
              if ((int)uVar2 <= (int)uVar9) goto LAB_00760775;
              pGVar4[uVar9].Value = pGVar4[uVar9].Value + 1;
            }
          }
          piVar1 = pGVar3->pSibls;
          if ((piVar1 != (int *)0x0) && (*(int *)((long)piVar1 + lVar10) != 0)) {
            if (uVar2 <= *(uint *)((long)piVar1 + lVar10)) {
LAB_00760775:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar9 = (uint)*(undefined8 *)(pGVar4 + *(uint *)((long)piVar1 + lVar10));
            if (((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) &&
               ((((uint)((ulong)*(undefined8 *)(pGVar4 + *(uint *)((long)piVar1 + lVar10)) >> 0x20)
                 ^ uVar9) & 0x1fffffff) != 0)) {
              if (uVar2 <= *(uint *)((long)piVar1 + lVar10)) goto LAB_00760775;
              pGVar4[*(uint *)((long)piVar1 + lVar10)].Value =
                   pGVar4[*(uint *)((long)piVar1 + lVar10)].Value + 1;
            }
          }
        }
      }
      lVar11 = lVar11 + 0xc;
      lVar10 = lVar10 + 4;
    } while ((ulong)uVar2 * 0xc != lVar11);
  }
  return;
}

Assistant:

void Lf_ManSetCutRefs( Lf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    if ( Vec_PtrSize(&p->vMemSets) * (1 << LF_LOG_PAGE) != Vec_IntSize(&p->vFreeSets) )
        printf( "The number of used cutsets = %d.\n", Vec_PtrSize(&p->vMemSets) * (1 << LF_LOG_PAGE) - Vec_IntSize(&p->vFreeSets) );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        assert( pObj->Value == 0 );
        if ( Gia_ObjIsBuf(pObj) )
            continue;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin0(pObj)) )
            Gia_ObjFanin0(pObj)->Value++;
        if ( Gia_ObjIsAndNotBuf(Gia_ObjFanin1(pObj)) )
            Gia_ObjFanin1(pObj)->Value++;
        if ( Gia_ObjIsMuxId(p->pGia, i) && Gia_ObjIsAndNotBuf(Gia_ObjFanin2(p->pGia, pObj)) )
            Gia_ObjFanin2(p->pGia, pObj)->Value++;
        if ( Gia_ObjSibl(p->pGia, i) && Gia_ObjIsAndNotBuf(Gia_ObjSiblObj(p->pGia, i)) )
            Gia_ObjSiblObj(p->pGia, i)->Value++;
    }
}